

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

Vector<CFGNode_*> *
dxil_spv::CFGStructurizer::isolate_structured_sorted
          (Vector<CFGNode_*> *__return_storage_ptr__,CFGNode *header,CFGNode *merge)

{
  bool bVar1;
  size_type __n;
  reference ppCVar2;
  iterator iVar3;
  iterator iVar4;
  CFGNode *local_80;
  CFGNode *node;
  iterator __end1;
  iterator __begin1;
  UnorderedSet<CFGNode_*> *__range1;
  undefined1 local_58 [8];
  UnorderedSet<CFGNode_*> nodes;
  CFGNode *merge_local;
  CFGNode *header_local;
  Vector<CFGNode_*> *sorted;
  
  nodes._M_h._M_single_bucket = (__node_base_ptr)merge;
  std::
  unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
  ::unordered_set((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   *)local_58);
  isolate_structured((UnorderedSet<CFGNode_*> *)local_58,header,
                     (CFGNode *)nodes._M_h._M_single_bucket);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (__return_storage_ptr__);
  __n = std::
        unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ::size((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                *)local_58);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = std::
           unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ::begin((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    *)local_58);
  node = (CFGNode *)
         std::
         unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ::end((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                *)local_58);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<dxil_spv::CFGNode_*,_false>,
                            (_Node_iterator_base<dxil_spv::CFGNode_*,_false> *)&node), bVar1) {
    ppCVar2 = std::__detail::_Node_iterator<dxil_spv::CFGNode_*,_true,_false>::operator*(&__end1);
    local_80 = *ppCVar2;
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
    push_back(__return_storage_ptr__,&local_80);
    std::__detail::_Node_iterator<dxil_spv::CFGNode_*,_true,_false>::operator++(&__end1);
  }
  iVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          begin(__return_storage_ptr__);
  iVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGStructurizer::isolate_structured_sorted(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)::__0>
            (iVar3._M_current,iVar4._M_current);
  std::
  unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
  ::~unordered_set((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Vector<CFGNode *> CFGStructurizer::isolate_structured_sorted(const CFGNode *header, const CFGNode *merge)
{
	UnorderedSet<CFGNode *> nodes;
	isolate_structured(nodes, header, merge);

	Vector<CFGNode *> sorted;
	sorted.reserve(nodes.size());

	for (auto *node : nodes)
		sorted.push_back(node);

	std::sort(sorted.begin(), sorted.end(),
	          [](const CFGNode *a, const CFGNode *b) { return a->forward_post_visit_order > b->forward_post_visit_order; });
	return sorted;
}